

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

void __thiscall cali::Log::perror(Log *this,char *__s)

{
  int iVar1;
  ostream *poVar2;
  char *pcVar3;
  char *in_RDX;
  char local_a8 [8];
  char buf [120];
  char *msg_local;
  int errnum_local;
  Log *this_local;
  
  iVar1 = verbosity();
  if (this->m_level <= iVar1) {
    poVar2 = get_stream(this);
    poVar2 = std::operator<<(poVar2,in_RDX);
    pcVar3 = strerror_r((int)__s,local_a8,0x78);
    std::operator<<(poVar2,pcVar3);
  }
  return;
}

Assistant:

std::ostream& Log::perror(int errnum, const char* msg)
{
    if (verbosity() < m_level)
        return m_nullstream;

#ifdef _GLIBCXX_HAVE_STRERROR_R
    char buf[120];
    return get_stream() << msg << strerror_r(errnum, buf, sizeof(buf));
#else
    return get_stream() << msg << strerror(errnum);
#endif
}